

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

int tnt_reply_hdr0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  uint64_t uVar2;
  ulong uStack_68;
  uint32_t key;
  uint64_t bitmap;
  uint64_t schema_id;
  uint64_t code;
  uint64_t sync;
  byte *pbStack_40;
  uint32_t n;
  char *p;
  char *test;
  size_t *off_local;
  size_t size_local;
  char *buf_local;
  tnt_reply *r_local;
  
  pbStack_40 = (byte *)buf;
  p = buf;
  test = (char *)off;
  off_local = (size_t *)size;
  size_local = (size_t)buf;
  buf_local = (char *)r;
  iVar1 = mp_check(&p,buf + size);
  if (iVar1 == 0) {
    r_local._7_1_ = *pbStack_40;
    if (mp_type_hint[r_local._7_1_] == MP_MAP) {
      sync._4_4_ = mp_decode_map((char **)&stack0xffffffffffffffc0);
      code = 0;
      schema_id = 0;
      bitmap = 0;
      uStack_68 = 0;
      while (sync._4_4_ != 0) {
        r_local._6_1_ = *pbStack_40;
        if (mp_type_hint[r_local._6_1_] != MP_UINT) {
          return -1;
        }
        uVar2 = mp_decode_uint((char **)&stack0xffffffffffffffc0);
        iVar1 = (int)uVar2;
        r_local._5_1_ = *pbStack_40;
        if (mp_type_hint[r_local._5_1_] != MP_UINT) {
          return -1;
        }
        if (iVar1 == 0) {
          schema_id = mp_decode_uint((char **)&stack0xffffffffffffffc0);
        }
        else if (iVar1 == 1) {
          code = mp_decode_uint((char **)&stack0xffffffffffffffc0);
        }
        else {
          if (iVar1 != 5) {
            return -1;
          }
          bitmap = mp_decode_uint((char **)&stack0xffffffffffffffc0);
        }
        uStack_68 = 1L << ((byte)uVar2 & 0x3f) | uStack_68;
        sync._4_4_ = sync._4_4_ - 1;
      }
      if (buf_local != (char *)0x0) {
        *(uint64_t *)(buf_local + 0x28) = code;
        *(uint64_t *)(buf_local + 0x20) = schema_id & 0x7fff;
        *(uint64_t *)(buf_local + 0x30) = bitmap;
        *(ulong *)(buf_local + 8) = uStack_68;
      }
      if (test != (char *)0x0) {
        *(size_t *)test = (long)pbStack_40 - size_local;
      }
      r_local._0_4_ = 0;
    }
    else {
      r_local._0_4_ = -1;
    }
  }
  else {
    r_local._0_4_ = -1;
  }
  return (int)r_local;
}

Assistant:

int
tnt_reply_hdr0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;

	uint32_t n = mp_decode_map(&p);
	uint64_t sync = 0, code = 0, schema_id = 0, bitmap = 0;
	while (n-- > 0) {
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		uint32_t key = mp_decode_uint(&p);
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		switch (key) {
		case TNT_SYNC:
			sync = mp_decode_uint(&p);
			break;
		case TNT_CODE:
			code = mp_decode_uint(&p);
			break;
		case TNT_SCHEMA_ID:
			schema_id = mp_decode_uint(&p);
			break;
		default:
			return -1;
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->sync = sync;
		r->code = code & ((1 << 15) - 1);
		r->schema_id = schema_id;
		r->bitmap = bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}